

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

p_ply ply_open(char *name,p_ply_error_cb error_cb,long idata,void *pdata)

{
  int iVar1;
  p_ply __ptr;
  size_t sVar2;
  gzFile pgVar3;
  FILE *pFVar4;
  code *pcVar5;
  
  __ptr = (p_ply)calloc(1,0x20f8);
  pcVar5 = ply_error_cb;
  if (error_cb != (p_ply_error_cb)0x0) {
    pcVar5 = error_cb;
  }
  if (__ptr == (p_ply)0x0) {
    (*pcVar5)((p_ply)0x0,"Out of memory");
    return (p_ply)0x0;
  }
  __ptr->idata = idata;
  __ptr->pdata = pdata;
  __ptr->error_cb = pcVar5;
  sVar2 = strlen(name);
  if ((((sVar2 < 4) || (name[sVar2 - 3] != '.')) ||
      (iVar1 = tolower((int)name[sVar2 - 2]), iVar1 != 0x67)) ||
     (iVar1 = tolower((int)name[sVar2 - 1]), iVar1 != 0x7a)) {
    pFVar4 = fopen(name,"rb");
    if (pFVar4 == (FILE *)0x0) goto LAB_002c1ba0;
    pgVar3 = (gzFile)0x0;
  }
  else {
    pgVar3 = (gzFile)gzopen(name,"rb");
    if (pgVar3 == (gzFile)0x0) {
LAB_002c1ba0:
      (*pcVar5)(__ptr,"Unable to open file");
      free(__ptr);
      return (p_ply)0x0;
    }
    pFVar4 = (FILE *)0x0;
  }
  __ptr->fp = (FILE *)pFVar4;
  __ptr->gzfp = pgVar3;
  return __ptr;
}

Assistant:

p_ply ply_open(const char *name, p_ply_error_cb error_cb, long idata,
               void *pdata) {
    FILE *fp = NULL;
    gzFile gzfp = NULL;
    p_ply ply = ply_alloc();
    if (error_cb == NULL) error_cb = ply_error_cb;
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_READ;
    ply->error_cb = error_cb;
    if (!ply_type_check()) {
        error_cb(ply, "Incompatible type system");
        free(ply);
        return NULL;
    }
    assert(name);
    // Is it gzipped?
    if (strlen(name) > 3 &&
        name[strlen(name)-3] == '.' &&
        std::tolower(name[strlen(name)-2]) == 'g' &&
        std::tolower(name[strlen(name)-1]) == 'z') {
         gzfp = gzopen(name, "rb");
         if (!gzfp) {
            error_cb(ply, "Unable to open file");
            free(ply);
            return NULL;
        }
    }
    else {
        fp = fopen(name, "rb");
        if (!fp) {
            error_cb(ply, "Unable to open file");
            free(ply);
            return NULL;
        }
    }
    ply->fp = fp;
    ply->gzfp = gzfp;
    return ply;
}